

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O1

void AudioBackend_SetOrganyaTimer(unsigned_short timer)

{
  if (organya_mutex.pContext != (ma_context *)0x0) {
    (*((organya_mutex.pContext)->field_22).posix.pthread_mutex_lock)(0x12a848);
  }
  organya_timer = timer;
  if (organya_mutex.pContext != (ma_context *)0x0) {
    (*((organya_mutex.pContext)->field_22).posix.pthread_mutex_unlock)(0x12a848);
    return;
  }
  return;
}

Assistant:

void AudioBackend_SetOrganyaTimer(unsigned short timer)
{
	ma_mutex_lock(&organya_mutex);

	organya_timer = timer;

	ma_mutex_unlock(&organya_mutex);
}